

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

bool __thiscall
Js::FunctionExecutionStateMachine::TryTransitionToJitExecutionMode
          (FunctionExecutionStateMachine *this)

{
  ExecutionMode EVar1;
  ExecutionMode EVar2;
  FunctionBody *this_00;
  ExecutionMode previousExecutionMode;
  FunctionExecutionStateMachine *this_local;
  
  EVar1 = GetExecutionMode(this);
  TryTransitionToNextExecutionMode(this);
  EVar2 = GetExecutionMode(this);
  if (EVar2 != SimpleJit) {
    if (EVar2 != FullJit) {
      return false;
    }
    if (this->fullJitRequeueThreshold != 0) {
      this->fullJitRequeueThreshold = this->fullJitRequeueThreshold - 1;
      return false;
    }
  }
  EVar2 = GetExecutionMode(this);
  if (EVar2 != EVar1) {
    this_00 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    FunctionBody::TraceExecutionMode(this_00,(char *)0x0);
  }
  return true;
}

Assistant:

bool FunctionExecutionStateMachine::TryTransitionToJitExecutionMode()
    {
        const ExecutionMode previousExecutionMode = GetExecutionMode();

        TryTransitionToNextExecutionMode();
        switch (GetExecutionMode())
        {
        case ExecutionMode::SimpleJit:
            break;

        case ExecutionMode::FullJit:
            if (fullJitRequeueThreshold == 0)
            {
                break;
            }
            --fullJitRequeueThreshold;
            return false;

        default:
            return false;
        }

        if (GetExecutionMode() != previousExecutionMode)
        {
            owner->TraceExecutionMode();
        }
        return true;
    }